

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::script_cltv_truncated::test_method(script_cltv_truncated *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar4;
  undefined4 local_164;
  undefined1 local_160 [16];
  undefined1 *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  ScriptError err;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack_ignore;
  undefined4 *local_d0;
  assertion_result local_c8;
  undefined4 **local_b0;
  ScriptError *local_a8;
  char *local_a0;
  char *local_98;
  assertion_result local_90;
  direct_or_indirect local_78;
  uint local_5c;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = 0;
  uStack_40 = (ScriptError **)0x0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xb1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
             (uchar *)&local_c8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
  if (0x1c < uStack_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  stack_ignore.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack_ignore.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack_ignore.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3e8;
  file.m_begin = (iterator)&local_100;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
  local_90._0_8_ = &PTR_CheckECDSASignature_0138d260;
  _cVar4 = 0x5dd9e2;
  bVar1 = EvalScript(&stack_ignore,(CScript *)&local_78.indirect_contents,0x200,
                     (BaseSignatureChecker *)&local_90,BASE,&err);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  uStack_40 = (ScriptError **)local_160;
  local_160._0_8_ =
       "!EvalScript(stack_ignore, script_cltv_trunc, SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_160._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_118 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,(lazy_ostream *)local_58,1,0,WARN,_cVar4,(size_t)&local_120,1000);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3e9;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_01388f08;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_INVALID_STACK_OPERATION)
  ;
  local_d0 = &local_164;
  local_164 = 0x11;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_98 = "";
  uStack_40 = &local_a8;
  local_a8 = &err;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0138d2a0;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_c8.m_message.px = (element_type *)((ulong)local_c8.m_message.px & 0xffffffffffffff00);
  local_c8._0_8_ = &PTR__lazy_ostream_0138d2a0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_160,1,2,REQUIRE,0x10f64c2,(size_t)&local_a0,0x3e9,
             (lazy_ostream *)local_58,"SCRIPT_ERR_INVALID_STACK_OPERATION",&local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&stack_ignore);
  if (0x1c < local_5c) {
    free(local_78.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_cltv_truncated)
{
    const auto script_cltv_trunc = CScript() << OP_CHECKLOCKTIMEVERIFY;

    std::vector<std::vector<unsigned char>> stack_ignore;
    ScriptError err;
    BOOST_CHECK(!EvalScript(stack_ignore, script_cltv_trunc, SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_INVALID_STACK_OPERATION);
}